

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-validator.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_62176::throwing_error_handler::error
          (throwing_error_handler *this,json_pointer *ptr,json *instance,string *message)

{
  undefined8 *puVar1;
  invalid_argument *this_00;
  undefined8 *puVar2;
  long *plVar3;
  ulong *puVar4;
  size_type *psVar5;
  long *plVar6;
  ulong uVar7;
  undefined8 uVar8;
  undefined8 *local_150;
  undefined8 local_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 *local_130;
  undefined8 local_128;
  undefined8 local_120;
  undefined8 uStack_118;
  ulong *local_110;
  long local_108;
  ulong local_100 [2];
  ulong *local_f0;
  long local_e8;
  ulong local_e0;
  long lStack_d8;
  string_t local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string_t local_90;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  local_110 = local_100;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"At ","");
  nlohmann::json_abi_v3_11_2::
  json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  to_string(&local_90,ptr);
  uVar7 = 0xf;
  if (local_110 != local_100) {
    uVar7 = local_100[0];
  }
  if (uVar7 < local_90._M_string_length + local_108) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      uVar8 = local_90.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar8 < local_90._M_string_length + local_108) goto LAB_00127e14;
    puVar2 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_110);
  }
  else {
LAB_00127e14:
    puVar2 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_90._M_dataplus._M_p);
  }
  local_150 = (undefined8 *)*puVar2;
  puVar1 = puVar2 + 2;
  if (local_150 == puVar1) {
    local_140 = *puVar1;
    uStack_138 = puVar2[3];
    local_150 = &local_140;
  }
  else {
    local_140 = *puVar1;
  }
  local_148 = puVar2[1];
  *puVar2 = puVar1;
  puVar2[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_150);
  local_f0 = (ulong *)*plVar3;
  puVar4 = (ulong *)(plVar3 + 2);
  if (local_f0 == puVar4) {
    local_e0 = *puVar4;
    lStack_d8 = plVar3[3];
    local_f0 = &local_e0;
  }
  else {
    local_e0 = *puVar4;
  }
  local_e8 = plVar3[1];
  *plVar3 = (long)puVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::dump(&local_d0,instance,-1,' ',false,strict);
  uVar7 = 0xf;
  if (local_f0 != &local_e0) {
    uVar7 = local_e0;
  }
  if (uVar7 < local_d0._M_string_length + local_e8) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      uVar8 = local_d0.field_2._M_allocated_capacity;
    }
    if (local_d0._M_string_length + local_e8 <= (ulong)uVar8) {
      puVar2 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_f0);
      goto LAB_00127f61;
    }
  }
  puVar2 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_d0._M_dataplus._M_p);
LAB_00127f61:
  local_130 = (undefined8 *)*puVar2;
  puVar1 = puVar2 + 2;
  if (local_130 == puVar1) {
    local_120 = *puVar1;
    uStack_118 = puVar2[3];
    local_130 = &local_120;
  }
  else {
    local_120 = *puVar1;
  }
  local_128 = puVar2[1];
  *puVar2 = puVar1;
  puVar2[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_130);
  local_b0._M_dataplus._M_p = (pointer)*plVar3;
  psVar5 = (size_type *)(plVar3 + 2);
  if ((size_type *)local_b0._M_dataplus._M_p == psVar5) {
    local_b0.field_2._M_allocated_capacity = *psVar5;
    local_b0.field_2._8_8_ = plVar3[3];
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  }
  else {
    local_b0.field_2._M_allocated_capacity = *psVar5;
  }
  local_b0._M_string_length = plVar3[1];
  *plVar3 = (long)psVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::operator+(&local_50,&local_b0,message);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_70 = (long *)*plVar3;
  plVar6 = plVar3 + 2;
  if (local_70 == plVar6) {
    local_60 = *plVar6;
    lStack_58 = plVar3[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar6;
  }
  local_68 = plVar3[1];
  *plVar3 = (long)plVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::invalid_argument::invalid_argument(this_00,(string *)&local_70);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void error(const json::json_pointer &ptr, const json &instance, const std::string &message) override
	{
		throw std::invalid_argument(std::string("At ") + ptr.to_string() + " of " + instance.dump() + " - " + message + "\n");
	}